

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvariablebyte.h
# Opt level: O1

void __thiscall FastPForLib::StreamVByte::~StreamVByte(StreamVByte *this)

{
  operator_delete(this);
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t count, uint32_t *out,
                   size_t &nvalue) {
    size_t bytesWritten = svb_encode(
        (uint8_t *)out, in, static_cast<uint32_t>(std::min<size_t>(
                                count, std::numeric_limits<uint32_t>::max())),
        0, 1);
    nvalue = static_cast<size_t>(bytesWritten + 3) / 4;
    for (size_t i = bytesWritten; i < nvalue * 4; ++i)
      reinterpret_cast<uint8_t*>(out)[i] = 0;
  }